

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectProgramResourceiv
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **subroutine_names,
          GLchar **uniform_names)

{
  ostringstream *this_00;
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 err;
  undefined4 extraout_var;
  size_t sVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  GLuint i;
  long lVar10;
  GLenum prop;
  vector<int,_std::allocator<int>_> compatible_subroutines;
  GLenum local_1d8 [8];
  GLchar **local_1b8;
  MessageBuilder message;
  
  local_1b8 = uniform_names;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1d8[5] = this->m_n_active_subroutines;
  bVar8 = true;
  if (0 < (int)local_1d8[5]) {
    lVar9 = 0;
    do {
      pcVar2 = subroutine_names[lVar9];
      sVar6 = strlen(pcVar2);
      bVar3 = checkProgramResourceiv(this,program_id,0x92e8,0x92f9,pcVar2,(int)sVar6 + 1);
      bVar8 = (bool)(bVar8 & bVar3);
      lVar9 = lVar9 + 1;
      local_1d8[5] = this->m_n_active_subroutines;
    } while (lVar9 < (int)local_1d8[5]);
  }
  local_1d8[0] = 0x92f9;
  local_1d8[2] = 0x92fb;
  local_1d8[3] = 1;
  local_1d8[4] = 0x8e4a;
  local_1d8[6] = 0x930e;
  if (0 < this->m_n_active_subroutine_uniforms) {
    lVar9 = 0;
    do {
      pcVar2 = local_1b8[lVar9];
      sVar6 = strlen(pcVar2);
      local_1d8[7] = getSubroutineUniformLocation(this,program_id,pcVar2,true);
      local_1d8[1] = (int)sVar6 + 1;
      lVar10 = 0;
      do {
        bVar3 = checkProgramResourceiv
                          (this,program_id,0x92ee,local_1d8[lVar10 * 2],pcVar2,
                           local_1d8[lVar10 * 2 + 1]);
        bVar8 = (bool)(bVar8 & bVar3);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      GVar5 = getProgramResourceIndex(this,program_id,0x92ee,pcVar2);
      if (GVar5 != 0xffffffff) {
        compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        prop = 0x8e4b;
        std::vector<int,_std::allocator<int>_>::resize
                  (&compatible_subroutines,(long)this->m_n_active_subroutines);
        (**(code **)(CONCAT44(extraout_var,iVar4) + 0x9c8))
                  (program_id,0x92ee,GVar5,1,&prop,this->m_n_active_subroutines,0,
                   compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
        err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
        glu::checkError(err,"GetProgramResourceiv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0xd47);
        iVar1 = this->m_n_active_subroutines;
        if ((long)iVar1 < 1) {
          iVar7 = 0;
        }
        else {
          lVar10 = 0;
          iVar7 = 0;
          do {
            iVar7 = iVar7 + compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar10];
            lVar10 = lVar10 + 1;
          } while (iVar1 != lVar10);
        }
        if (((iVar1 + -1) * iVar1) / 2 != iVar7) {
          message.m_log = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          this_00 = &message.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                     "Error. Invalid result. Function: getProgramResourceiv. ",0x37);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                     "Program interface: GL_VERTEX_SUBROUTINE_UNIFORM. ",0x31);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Resource name: ",
                     0xf);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)this_00 +
                            (int)message.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream[-3]);
          }
          else {
            sVar6 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar2,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,". ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                     "Property: GL_COMPATIBLE_SUBROUTINES. ",0x25);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Results: ",9);
          if (1 < this->m_n_active_subroutines) {
            lVar10 = 1;
            do {
              std::ostream::operator<<
                        (this_00,compatible_subroutines.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar10]);
              lVar10 = lVar10 + 1;
            } while (lVar10 < this->m_n_active_subroutines);
          }
          tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          std::ios_base::~ios_base
                    ((ios_base *)
                     &message.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
          bVar8 = false;
        }
        if (compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->m_n_active_subroutine_uniforms);
  }
  return bVar8;
}

Assistant:

bool FunctionalTest3_4::inspectProgramResourceiv(GLuint program_id, const GLchar** subroutine_names,
												 const GLchar** uniform_names) const
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	for (GLint subroutine = 0; subroutine < m_n_active_subroutines; ++subroutine)
	{
		const GLchar* subroutine_name = subroutine_names[subroutine];
		const GLint   length		  = (GLint)strlen(subroutine_name) + 1;

		if (false == checkProgramResourceiv(program_id, GL_VERTEX_SUBROUTINE, GL_NAME_LENGTH, subroutine_name, length))
		{
			result = false;
		}
	}

	inspectionDetails details[] = {
		{ GL_NAME_LENGTH, 0 },
		{ GL_ARRAY_SIZE, 1 },
		{ GL_NUM_COMPATIBLE_SUBROUTINES, m_n_active_subroutines },
		{ GL_LOCATION, 0 },
	};
	const GLuint n_details = sizeof(details) / sizeof(details[0]);

	for (GLint uniform = 0; uniform < m_n_active_subroutine_uniforms; ++uniform)
	{
		const GLchar* uniform_name = uniform_names[uniform];
		const GLint   length	   = (GLint)strlen(uniform_name) + 1;
		const GLint   location	 = getSubroutineUniformLocation(program_id, uniform_name, true);

		details[0].expected_value = length;
		details[3].expected_value = location;

		for (GLuint i = 0; i < n_details; ++i)
		{
			if (false == checkProgramResourceiv(program_id, GL_VERTEX_SUBROUTINE_UNIFORM, details[i].pname,
												uniform_name, details[i].expected_value))
			{
				result = false;
			}
		}

		/* Check compatible subroutines */
		GLuint index = getProgramResourceIndex(program_id, GL_VERTEX_SUBROUTINE_UNIFORM, uniform_name);

		if (GL_INVALID_INDEX != index)
		{
			std::vector<GLint> compatible_subroutines;
			GLint			   index_sum = 0;
			GLenum			   prop		 = GL_COMPATIBLE_SUBROUTINES;

			compatible_subroutines.resize(m_n_active_subroutines);

			gl.getProgramResourceiv(program_id, GL_VERTEX_SUBROUTINE_UNIFORM, index, 1, &prop, m_n_active_subroutines,
									0, &compatible_subroutines[0]);

			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramResourceiv");

			/* Expected indices are 0, 1, 2, ... N */
			for (GLint i = 0; i < m_n_active_subroutines; ++i)
			{
				index_sum += compatible_subroutines[i];
			}

			/* Sum of E1, ..., EN = (E1 + EN) * N / 2 */
			if (((m_n_active_subroutines - 1) * m_n_active_subroutines) / 2 != index_sum)
			{
				tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

				message << "Error. Invalid result. Function: getProgramResourceiv. "
						<< "Program interface: GL_VERTEX_SUBROUTINE_UNIFORM. "
						<< "Resource name: " << uniform_name << ". "
						<< "Property: GL_COMPATIBLE_SUBROUTINES. "
						<< "Results: ";

				for (GLint i = 1; i < m_n_active_subroutines; ++i)
				{
					message << compatible_subroutines[i];
				}

				message << tcu::TestLog::EndMessage;

				result = false;
			}
		}
	}

	return result;
}